

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O2

void __thiscall
vkt::Draw::anon_unknown_0::DrawIndexedIndirectParams::addCommand
          (DrawIndexedIndirectParams *this,deUint32 indexC,deUint32 instanceC,deUint32 firstIdx,
          deInt32 vertexO,deUint32 firstIns)

{
  VkDrawIndexedIndirectCommand cmd;
  value_type local_14;
  
  local_14.instanceCount = 1;
  local_14.firstInstance = 0;
  local_14.indexCount = indexC;
  local_14.firstIndex = instanceC;
  local_14.vertexOffset = firstIdx;
  std::vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>::
  push_back(&this->commands,&local_14);
  return;
}

Assistant:

void addCommand (const deUint32 indexC, const deUint32 instanceC, const deUint32 firstIdx, const deInt32 vertexO, const deUint32 firstIns)
	{
		vk::VkDrawIndexedIndirectCommand	cmd;
		cmd.indexCount						= indexC;
		cmd.instanceCount					= instanceC;
		cmd.firstIndex						= firstIdx;
		cmd.vertexOffset					= vertexO;
		cmd.firstInstance					= firstIns;

		commands.push_back(cmd);
	}